

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

void __thiscall UniValue::setFloat(UniValue *this,double val_)

{
  string str;
  long in_FS_OFFSET;
  ostringstream oss;
  undefined1 in_stack_fffffffffffffe50 [24];
  long local_190;
  undefined8 local_188 [46];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x10;
  std::ostream::_M_insert<double>(val_);
  std::__cxx11::stringbuf::str();
  str._M_string_length = in_stack_fffffffffffffe50._0_8_;
  str.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )in_stack_fffffffffffffe50._8_16_;
  str._M_dataplus._M_p = (pointer)val_;
  setNumStr(this,str);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::setFloat(double val_)
{
    std::ostringstream oss;

    oss << std::setprecision(16) << val_;

    return setNumStr(oss.str());
}